

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

void __thiscall
icu_63::SimpleTimeZone::SimpleTimeZone
          (SimpleTimeZone *this,int32_t rawOffsetGMT,UnicodeString *ID,int8_t savingsStartMonth,
          int8_t savingsStartDay,int8_t savingsStartDayOfWeek,int32_t savingsStartTime,
          int8_t savingsEndMonth,int8_t savingsEndDay,int8_t savingsEndDayOfWeek,
          int32_t savingsEndTime,int32_t savingsDST,UErrorCode *status)

{
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,ID);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleTimeZone_00478fe8;
  this->transitionRulesInitialized = '\0';
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTransition = (TimeZoneTransition *)0x0;
  this->stdRule = (AnnualTimeZoneRule *)0x0;
  this->dstRule = (AnnualTimeZoneRule *)0x0;
  construct(this,rawOffsetGMT,savingsStartMonth,savingsStartDay,savingsStartDayOfWeek,
            savingsStartTime,WALL_TIME,savingsEndMonth,savingsEndDay,savingsEndDayOfWeek,
            savingsEndTime,WALL_TIME,savingsDST,status);
  return;
}

Assistant:

SimpleTimeZone::SimpleTimeZone(int32_t rawOffsetGMT, const UnicodeString& ID,
    int8_t savingsStartMonth, int8_t savingsStartDay,
    int8_t savingsStartDayOfWeek, int32_t savingsStartTime,
    int8_t savingsEndMonth, int8_t savingsEndDay,
    int8_t savingsEndDayOfWeek, int32_t savingsEndTime,
    int32_t savingsDST, UErrorCode& status)
:   BasicTimeZone(ID)
{
    clearTransitionRules();
    construct(rawOffsetGMT,
              savingsStartMonth, savingsStartDay, savingsStartDayOfWeek,
              savingsStartTime, WALL_TIME,
              savingsEndMonth, savingsEndDay, savingsEndDayOfWeek,
              savingsEndTime, WALL_TIME,
              savingsDST, status);
}